

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmPolicies.cxx
# Opt level: O0

bool cmPolicies::ApplyPolicyVersion(cmMakefile *mf,char *version)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  PolicyStatus PVar6;
  size_t sVar7;
  undefined8 uVar8;
  ostream *poVar9;
  char *pcVar10;
  byte local_4ea;
  allocator local_409;
  string local_408;
  PolicyStatus local_3e8;
  value_type local_3e4;
  PolicyStatus status;
  PolicyID pid;
  vector<cmPolicies::PolicyID,_std::allocator<cmPolicies::PolicyID>_> ancientPolicies;
  undefined1 local_3a8 [8];
  ostringstream e_1;
  allocator local_229;
  string local_228;
  undefined4 local_204;
  string local_200;
  undefined1 local_1e0 [8];
  ostringstream e;
  uint local_64;
  uint local_60;
  uint tweakVer;
  uint patchVer;
  uint minorVer;
  uint majorVer;
  allocator local_41;
  string local_40 [8];
  string ver;
  char *version_local;
  cmMakefile *mf_local;
  
  ver.field_2._8_8_ = version;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,"2.4.0",&local_41);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  if ((ver.field_2._8_8_ != 0) && (sVar7 = strlen((char *)ver.field_2._8_8_), sVar7 != 0)) {
    std::__cxx11::string::operator=(local_40,(char *)ver.field_2._8_8_);
  }
  patchVer = 2;
  tweakVer = 0;
  local_60 = 0;
  local_64 = 0;
  uVar8 = std::__cxx11::string::c_str();
  iVar2 = __isoc99_sscanf(uVar8,"%u.%u.%u.%u",&patchVer,&tweakVer,&local_60,&local_64);
  uVar5 = patchVer;
  if (iVar2 < 2) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e0);
    poVar9 = std::operator<<((ostream *)local_1e0,"Invalid policy version value \"");
    poVar9 = std::operator<<(poVar9,local_40);
    poVar9 = std::operator<<(poVar9,"\".  ");
    std::operator<<(poVar9,"A numeric major.minor[.patch[.tweak]] must be given.");
    std::__cxx11::ostringstream::str();
    cmMakefile::IssueMessage(mf,FATAL_ERROR,&local_200);
    std::__cxx11::string::~string((string *)&local_200);
    mf_local._7_1_ = false;
    local_204 = 1;
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e0);
  }
  else if ((patchVer < 2) || ((patchVer == 2 && (tweakVer < 4)))) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_228,
               "Compatibility with CMake < 2.4 is not supported by CMake >= 3.0.  For compatibility with older versions please use any CMake 2.8.x release or lower."
               ,&local_229);
    cmMakefile::IssueMessage(mf,FATAL_ERROR,&local_228);
    std::__cxx11::string::~string((string *)&local_228);
    std::allocator<char>::~allocator((allocator<char> *)&local_229);
    mf_local._7_1_ = false;
    local_204 = 1;
  }
  else {
    uVar3 = cmVersion::GetMajorVersion();
    uVar4 = patchVer;
    if ((((uVar3 < uVar5) ||
         ((uVar3 = cmVersion::GetMajorVersion(), uVar5 = tweakVer, uVar4 == uVar3 &&
          (uVar4 = cmVersion::GetMinorVersion(), uVar4 < uVar5)))) ||
        ((uVar4 = patchVer, uVar3 = cmVersion::GetMajorVersion(), uVar5 = tweakVer, uVar4 == uVar3
         && ((uVar3 = cmVersion::GetMinorVersion(), uVar4 = local_60, uVar5 == uVar3 &&
             (uVar5 = cmVersion::GetPatchVersion(), uVar5 < uVar4)))))) ||
       ((uVar4 = patchVer, uVar3 = cmVersion::GetMajorVersion(), uVar5 = tweakVer, uVar4 == uVar3 &&
        (((uVar3 = cmVersion::GetMinorVersion(), uVar4 = local_60, uVar5 == uVar3 &&
          (uVar3 = cmVersion::GetPatchVersion(), uVar5 = local_64, uVar4 == uVar3)) &&
         (uVar4 = cmVersion::GetTweakVersion(), uVar4 < uVar5)))))) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3a8);
      poVar9 = std::operator<<((ostream *)local_3a8,
                               "An attempt was made to set the policy version of CMake to \"");
      poVar9 = std::operator<<(poVar9,(char *)ver.field_2._8_8_);
      poVar9 = std::operator<<(poVar9,"\" which is greater than this version of CMake.  ");
      poVar9 = std::operator<<(poVar9,
                               "This is not allowed because the greater version may have new ");
      poVar9 = std::operator<<(poVar9,"policies not known to this CMake.  ");
      std::operator<<(poVar9,"You may need a newer CMake version to build this project.");
      std::__cxx11::ostringstream::str();
      cmMakefile::IssueMessage
                (mf,FATAL_ERROR,
                 (string *)
                 &ancientPolicies.
                  super__Vector_base<cmPolicies::PolicyID,_std::allocator<cmPolicies::PolicyID>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
      std::__cxx11::string::~string
                ((string *)
                 &ancientPolicies.
                  super__Vector_base<cmPolicies::PolicyID,_std::allocator<cmPolicies::PolicyID>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
      mf_local._7_1_ = false;
      local_204 = 1;
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3a8);
    }
    else {
      std::vector<cmPolicies::PolicyID,_std::allocator<cmPolicies::PolicyID>_>::vector
                ((vector<cmPolicies::PolicyID,_std::allocator<cmPolicies::PolicyID>_> *)&status);
      for (local_3e4 = CMP0000; local_3e4 != CMPCOUNT; local_3e4 = local_3e4 + CMP0001) {
        bVar1 = isPolicyNewerThan(local_3e4,patchVer,tweakVer,local_60);
        if (bVar1) {
          PVar6 = GetPolicyStatus(local_3e4);
          if (PVar6 == REQUIRED_ALWAYS) {
            std::vector<cmPolicies::PolicyID,_std::allocator<cmPolicies::PolicyID>_>::push_back
                      ((vector<cmPolicies::PolicyID,_std::allocator<cmPolicies::PolicyID>_> *)
                       &status,&local_3e4);
          }
          else {
            local_3e8 = WARN;
            pcVar10 = idToString(local_3e4);
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)&local_408,pcVar10,&local_409);
            bVar1 = GetPolicyDefault(mf,&local_408,&local_3e8);
            local_4ea = 1;
            if (bVar1) {
              bVar1 = cmMakefile::SetPolicy(mf,local_3e4,local_3e8);
              local_4ea = bVar1 ^ 0xff;
            }
            std::__cxx11::string::~string((string *)&local_408);
            std::allocator<char>::~allocator((allocator<char> *)&local_409);
            if ((local_4ea & 1) != 0) {
              mf_local._7_1_ = false;
              goto LAB_004de245;
            }
          }
        }
        else {
          bVar1 = cmMakefile::SetPolicy(mf,local_3e4,NEW);
          if (!bVar1) {
            mf_local._7_1_ = false;
            goto LAB_004de245;
          }
        }
      }
      bVar1 = std::vector<cmPolicies::PolicyID,_std::allocator<cmPolicies::PolicyID>_>::empty
                        ((vector<cmPolicies::PolicyID,_std::allocator<cmPolicies::PolicyID>_> *)
                         &status);
      if (bVar1) {
        mf_local._7_1_ = true;
      }
      else {
        DiagnoseAncientPolicies
                  ((vector<cmPolicies::PolicyID,_std::allocator<cmPolicies::PolicyID>_> *)&status,
                   patchVer,tweakVer,local_60,mf);
        cmSystemTools::SetFatalErrorOccured();
        mf_local._7_1_ = false;
      }
LAB_004de245:
      local_204 = 1;
      std::vector<cmPolicies::PolicyID,_std::allocator<cmPolicies::PolicyID>_>::~vector
                ((vector<cmPolicies::PolicyID,_std::allocator<cmPolicies::PolicyID>_> *)&status);
    }
  }
  std::__cxx11::string::~string(local_40);
  return mf_local._7_1_;
}

Assistant:

bool cmPolicies::ApplyPolicyVersion(cmMakefile *mf,
                                    const char *version)
{
  std::string ver = "2.4.0";

  if (version && strlen(version) > 0)
    {
    ver = version;
    }

  unsigned int majorVer = 2;
  unsigned int minorVer = 0;
  unsigned int patchVer = 0;
  unsigned int tweakVer = 0;

  // parse the string
  if(sscanf(ver.c_str(), "%u.%u.%u.%u",
            &majorVer, &minorVer, &patchVer, &tweakVer) < 2)
    {
    std::ostringstream e;
    e << "Invalid policy version value \"" << ver << "\".  "
      << "A numeric major.minor[.patch[.tweak]] must be given.";
    mf->IssueMessage(cmake::FATAL_ERROR, e.str());
    return false;
    }

  // it is an error if the policy version is less than 2.4
  if (majorVer < 2 || (majorVer == 2 && minorVer < 4))
    {
    mf->IssueMessage(cmake::FATAL_ERROR,
      "Compatibility with CMake < 2.4 is not supported by CMake >= 3.0.  "
      "For compatibility with older versions please use any CMake 2.8.x "
      "release or lower.");
    return false;
    }

  // It is an error if the policy version is greater than the running
  // CMake.
  if (majorVer > cmVersion::GetMajorVersion() ||
      (majorVer == cmVersion::GetMajorVersion() &&
       minorVer > cmVersion::GetMinorVersion()) ||
      (majorVer == cmVersion::GetMajorVersion() &&
       minorVer == cmVersion::GetMinorVersion() &&
       patchVer > cmVersion::GetPatchVersion()) ||
      (majorVer == cmVersion::GetMajorVersion() &&
       minorVer == cmVersion::GetMinorVersion() &&
       patchVer == cmVersion::GetPatchVersion() &&
       tweakVer > cmVersion::GetTweakVersion()))
    {
    std::ostringstream e;
    e << "An attempt was made to set the policy version of CMake to \""
      << version << "\" which is greater than this version of CMake.  "
      << "This is not allowed because the greater version may have new "
      << "policies not known to this CMake.  "
      << "You may need a newer CMake version to build this project.";
    mf->IssueMessage(cmake::FATAL_ERROR, e.str());
    return false;
    }

  // now loop over all the policies and set them as appropriate
  std::vector<cmPolicies::PolicyID> ancientPolicies;
  for(PolicyID pid = cmPolicies::CMP0000;
      pid != cmPolicies::CMPCOUNT; pid = PolicyID(pid+1))
    {
    if (isPolicyNewerThan(pid, majorVer, minorVer, patchVer))
      {
      if(cmPolicies::GetPolicyStatus(pid) == cmPolicies::REQUIRED_ALWAYS)
        {
        ancientPolicies.push_back(pid);
        }
      else
        {
        cmPolicies::PolicyStatus status = cmPolicies::WARN;
        if(!GetPolicyDefault(mf, idToString(pid), &status) ||
           !mf->SetPolicy(pid, status))
          {
          return false;
          }
        }
      }
    else
      {
      if (!mf->SetPolicy(pid, cmPolicies::NEW))
        {
        return false;
        }
      }
    }

  // Make sure the project does not use any ancient policies.
  if(!ancientPolicies.empty())
    {
    DiagnoseAncientPolicies(ancientPolicies,
                            majorVer, minorVer, patchVer, mf);
    cmSystemTools::SetFatalErrorOccured();
    return false;
    }

  return true;
}